

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O0

bool __thiscall CCoinsViewCache::SpendCoin(CCoinsViewCache *this,COutPoint *outpoint,Coin *moveout)

{
  long lVar1;
  bool bVar2;
  size_t sVar3;
  pointer ppVar4;
  uint8_t flags;
  long in_RDX;
  CCoinsCacheEntry *in_RDI;
  long in_FS_OFFSET;
  iterator it;
  CoinsCachePair *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  Coin *in_stack_ffffffffffffffa8;
  _Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false> in_stack_ffffffffffffffb8
  ;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  FetchCoin((CCoinsViewCache *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
            (COutPoint *)in_RDI);
  std::
  unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
  ::end((unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
         *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  bVar2 = std::__detail::operator==
                    ((_Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false> *)
                     in_stack_ffffffffffffffa8,
                     (_Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false> *)
                     CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  if (bVar2) {
    bVar2 = false;
  }
  else {
    std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>::
    operator->((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> *)
               in_stack_ffffffffffffff98);
    sVar3 = Coin::DynamicMemoryUsage((Coin *)in_stack_ffffffffffffff98);
    *(size_t *)&in_RDI[6].m_flags = *(long *)&in_RDI[6].m_flags - sVar3;
    if (in_RDX != 0) {
      std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>::
      operator->((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> *)
                 in_stack_ffffffffffffff98);
      Coin::operator=(in_stack_ffffffffffffffa8,
                      (Coin *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
    }
    std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>::
    operator->((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> *)
               in_stack_ffffffffffffff98);
    bVar2 = CCoinsCacheEntry::IsFresh((CCoinsCacheEntry *)in_stack_ffffffffffffff98);
    if (bVar2) {
      std::
      unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
      ::erase((unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
               *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
              (iterator)in_stack_ffffffffffffffb8._M_cur);
    }
    else {
      ppVar4 = std::__detail::
               _Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>::
               operator->((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>
                           *)in_stack_ffffffffffffff98);
      flags = (uint8_t)((ulong)&ppVar4->second >> 0x38);
      std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>::
      operator*((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> *)
                in_stack_ffffffffffffff98);
      CCoinsCacheEntry::AddFlags
                (in_RDI,flags,
                 (CoinsCachePair *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff98);
      std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>::
      operator->((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> *)
                 in_stack_ffffffffffffff98);
      Coin::Clear((Coin *)in_stack_ffffffffffffff98);
    }
    bVar2 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CCoinsViewCache::SpendCoin(const COutPoint &outpoint, Coin* moveout) {
    CCoinsMap::iterator it = FetchCoin(outpoint);
    if (it == cacheCoins.end()) return false;
    cachedCoinsUsage -= it->second.coin.DynamicMemoryUsage();
    TRACE5(utxocache, spent,
           outpoint.hash.data(),
           (uint32_t)outpoint.n,
           (uint32_t)it->second.coin.nHeight,
           (int64_t)it->second.coin.out.nValue,
           (bool)it->second.coin.IsCoinBase());
    if (moveout) {
        *moveout = std::move(it->second.coin);
    }
    if (it->second.IsFresh()) {
        cacheCoins.erase(it);
    } else {
        it->second.AddFlags(CCoinsCacheEntry::DIRTY, *it, m_sentinel);
        it->second.coin.Clear();
    }
    return true;
}